

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isEquivalent(Type *this,Type *rhs)

{
  bool bVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  Type *rhs_00;
  IntegralType *pIVar4;
  IntegralType *pIVar5;
  Type *pTVar6;
  Type *pTVar7;
  DPIOpenArrayType *pDVar8;
  Type *in_RSI;
  Type *ri_1;
  Type *li_1;
  FixedSizeUnpackedArrayType *ra;
  FixedSizeUnpackedArrayType *la;
  IntegralType *ri;
  IntegralType *li;
  Type *r;
  Type *l;
  Type *in_stack_ffffffffffffff88;
  Type *in_stack_ffffffffffffff90;
  Type *in_stack_ffffffffffffff98;
  bool local_5a;
  bool local_59;
  Type *local_28;
  bool local_1;
  
  rhs_00 = getCanonicalType(in_stack_ffffffffffffff90);
  local_28 = getCanonicalType(in_stack_ffffffffffffff90);
  bVar1 = isMatching(&li->super_Type,&ri->super_Type);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar1 = isIntegral(in_stack_ffffffffffffff90);
    if ((((!bVar1) || (bVar1 = isIntegral(in_stack_ffffffffffffff90), !bVar1)) ||
        (bVar1 = isEnum((Type *)0x589acb), bVar1)) || (bVar1 = isEnum((Type *)0x589add), bVar1)) {
      if (((rhs_00->super_Symbol).kind == FixedSizeUnpackedArrayType) &&
         ((local_28->super_Symbol).kind == FixedSizeUnpackedArrayType)) {
        Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x589b93);
        Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x589ba2);
        bVar2 = ConstantRange::width((ConstantRange *)0x589bb5);
        bVar3 = ConstantRange::width((ConstantRange *)0x589bc7);
        local_5a = false;
        if (bVar2 == bVar3) {
          local_5a = isEquivalent(in_RSI,rhs_00);
        }
        local_1 = local_5a;
      }
      else {
        bVar1 = isUnpackedArray(in_stack_ffffffffffffff88);
        if ((bVar1) && ((rhs_00->super_Symbol).kind == (local_28->super_Symbol).kind)) {
          if ((rhs_00->super_Symbol).kind == AssociativeArrayType) {
            pTVar6 = getAssociativeIndexType(in_stack_ffffffffffffff88);
            pTVar7 = getAssociativeIndexType(in_stack_ffffffffffffff88);
            if (pTVar6 == (Type *)0x0) {
              if (pTVar7 != (Type *)0x0) {
                return false;
              }
            }
            else if ((pTVar7 == (Type *)0x0) || (bVar1 = isEquivalent(in_RSI,rhs_00), !bVar1)) {
              return false;
            }
          }
          pTVar6 = getArrayElementType(in_stack_ffffffffffffff98);
          getArrayElementType(pTVar6);
          local_1 = isEquivalent(in_RSI,rhs_00);
        }
        else {
          bVar1 = isUntypedType((Type *)0x589cd0);
          if ((bVar1) || (bVar1 = isUntypedType((Type *)0x589cde), bVar1)) {
            local_1 = true;
          }
          else {
            if (((rhs_00->super_Symbol).kind == DPIOpenArrayType) ||
               ((local_28->super_Symbol).kind == DPIOpenArrayType)) {
              if ((rhs_00->super_Symbol).kind != DPIOpenArrayType) {
                std::swap<slang::ast::Type_const*>((Type **)&stack0xffffffffffffffe0,&local_28);
              }
              pDVar8 = Symbol::as<slang::ast::DPIOpenArrayType>((Symbol *)0x589d25);
              if ((pDVar8->isPacked & 1U) != 0) {
                bVar1 = isIntegral(in_stack_ffffffffffffff90);
                return bVar1;
              }
              if (((local_28->super_Symbol).kind == FixedSizeUnpackedArrayType) ||
                 ((local_28->super_Symbol).kind == DynamicArrayType)) {
                getArrayElementType(in_stack_ffffffffffffff98);
                getArrayElementType(in_stack_ffffffffffffff98);
                bVar1 = isEquivalent(in_RSI,rhs_00);
                return bVar1;
              }
            }
            local_1 = false;
          }
        }
      }
    }
    else {
      pIVar4 = Symbol::as<slang::ast::IntegralType>((Symbol *)0x589aef);
      pIVar5 = Symbol::as<slang::ast::IntegralType>((Symbol *)0x589afe);
      local_59 = false;
      if (((pIVar4->isSigned & 1U) == (pIVar5->isSigned & 1U)) &&
         (local_59 = false, (pIVar4->isFourState & 1U) == (pIVar5->isFourState & 1U))) {
        local_59 = pIVar4->bitWidth == pIVar5->bitWidth;
      }
      local_1 = local_59;
    }
  }
  return local_1;
}

Assistant:

bool Type::isEquivalent(const Type& rhs) const {
    // See [6.22.2] for Equivalent Types
    const Type* l = &getCanonicalType();
    const Type* r = &rhs.getCanonicalType();
    if (l->isMatching(*r))
        return true;

    // (c) packed integral types are equivalent if signedness, four-statedness,
    // and bitwidth are the same.
    if (l->isIntegral() && r->isIntegral() && !l->isEnum() && !r->isEnum()) {
        const auto& li = l->as<IntegralType>();
        const auto& ri = r->as<IntegralType>();
        return li.isSigned == ri.isSigned && li.isFourState == ri.isFourState &&
               li.bitWidth == ri.bitWidth;
    }

    // (d) fixed size unpacked arrays are equivalent if element types are equivalent
    // and ranges are the same width; actual bounds may differ.
    if (l->kind == SymbolKind::FixedSizeUnpackedArrayType &&
        r->kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& la = l->as<FixedSizeUnpackedArrayType>();
        auto& ra = r->as<FixedSizeUnpackedArrayType>();
        return la.range.width() == ra.range.width() && la.elementType.isEquivalent(ra.elementType);
    }

    // (e) dynamic arrays, associative arrays, and queues are equivalent if they
    // are the same kind and have equivalent element types.
    if (l->isUnpackedArray() && l->kind == r->kind) {
        // Associative arrays additionally must have the same index type.
        if (l->kind == SymbolKind::AssociativeArrayType) {
            auto li = l->getAssociativeIndexType();
            auto ri = r->getAssociativeIndexType();
            if (li) {
                if (!ri || !li->isEquivalent(*ri))
                    return false;
            }
            else if (ri) {
                return false;
            }
        }

        return l->getArrayElementType()->isEquivalent(*r->getArrayElementType());
    }

    // The 'untyped' type is equivalent with everything.
    if (l->isUntypedType() || r->isUntypedType())
        return true;

    // Special case for DPI open arrays, which can only be declared for arguments
    // of DPI import functions. Arrays of any width can be converted to them,
    // which we will implement here even though it's not strictly "equivalent".
    if (l->kind == SymbolKind::DPIOpenArrayType || r->kind == SymbolKind::DPIOpenArrayType) {
        if (l->kind != SymbolKind::DPIOpenArrayType)
            std::swap(l, r);

        // Any integral type converts to a packed DPI open array.
        if (l->as<DPIOpenArrayType>().isPacked)
            return r->isIntegral();

        // Unpacked open arrays match fixed size unpacked arrays of any width.
        if (r->kind == SymbolKind::FixedSizeUnpackedArrayType ||
            r->kind == SymbolKind::DynamicArrayType) {
            return l->getArrayElementType()->isEquivalent(*r->getArrayElementType());
        }
    }

    return false;
}